

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

int32_t __thiscall icu_63::MessagePattern::hashCode(MessagePattern *this)

{
  UMessagePatternApostropheMode UVar1;
  int iVar2;
  Part *pPVar3;
  int32_t iVar4;
  int iVar5;
  long lVar6;
  
  UVar1 = this->aposMode;
  iVar4 = UnicodeString::doHashCode(&this->msg);
  iVar2 = this->partsLength;
  iVar5 = (iVar4 + UVar1 * 0x25) * 0x25 + iVar2;
  if (0 < (long)iVar2) {
    pPVar3 = this->parts;
    lVar6 = 0;
    do {
      iVar5 = ((uint)*(ushort *)((long)&pPVar3->length + lVar6) + iVar5 +
              (*(int *)((long)&pPVar3->type + lVar6) * 0x25 + *(int *)((long)&pPVar3->index + lVar6)
              ) * 0x25) * 0x25 + (int)*(short *)((long)&pPVar3->value + lVar6);
      lVar6 = lVar6 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar6);
  }
  return iVar5;
}

Assistant:

int32_t
MessagePattern::hashCode() const {
    int32_t hash=(aposMode*37+msg.hashCode())*37+partsLength;
    for(int32_t i=0; i<partsLength; ++i) {
        hash=hash*37+parts[i].hashCode();
    }
    return hash;
}